

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2bc05fa::EntriesProcessing::IncludeEntry
          (EntriesProcessing *this,LinkEntry *entry)

{
  TargetType TVar1;
  bool bVar2;
  
  if (this->Unicity == None) {
    return true;
  }
  if (this->Unicity == Shared) {
    if (entry->Target == (cmGeneratorTarget *)0x0) {
      return true;
    }
    TVar1 = cmGeneratorTarget::GetType(entry->Target);
    if (TVar1 != SHARED_LIBRARY) {
      return true;
    }
  }
  if (this->Unicity == All) {
    bVar2 = entry->Kind != Library;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IncludeEntry(LinkEntry const& entry) const
  {
    return this->Unicity == None ||
      (this->Unicity == Shared &&
       (entry.Target == nullptr ||
        entry.Target->GetType() != cmStateEnums::SHARED_LIBRARY)) ||
      (this->Unicity == All && entry.Kind != LinkEntry::Library);
  }